

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O0

void __thiscall QSqlQueryModel::setQuery(QSqlQueryModel *this,QSqlQuery *query)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QSqlQueryModelPrivate *pQVar4;
  size_type sVar5;
  QSqlDriver *pQVar6;
  ulong uVar7;
  QSqlQueryModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar8;
  bool columnsChanged;
  QSqlQueryModelPrivate *d;
  QSqlRecord newRec;
  QSqlError *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  QSqlQueryModelPrivate *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  ErrorType in_stack_fffffffffffffebc;
  ErrorType type;
  QString *in_stack_fffffffffffffec0;
  QString *databaseText;
  undefined7 in_stack_fffffffffffffec8;
  QSqlQueryModelPrivate *pQVar9;
  undefined1 local_118 [24];
  undefined8 local_100;
  quintptr local_f8;
  QAbstractItemModel *local_f0;
  undefined8 local_e8;
  quintptr local_e0;
  QAbstractItemModel *local_d8;
  undefined8 local_28;
  quintptr local_20;
  QAbstractItemModel *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QSqlQueryModel *)0x150375);
  beginResetModel((QSqlQueryModel *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSqlQuery::record((QSqlQuery *)in_stack_fffffffffffffec0);
  bVar1 = QSqlRecord::operator!=
                    ((QSqlRecord *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (QSqlRecord *)in_stack_fffffffffffffe88);
  sVar5 = QVLABaseBase::size((QVLABaseBase *)&pQVar4->colOffsets);
  iVar3 = QSqlRecord::count((QSqlRecord *)0x1503e7);
  pQVar9 = pQVar4;
  if ((sVar5 != iVar3) || ((bVar1 & 1) != 0)) {
    QSqlRecord::count((QSqlRecord *)0x150414);
    QSqlQueryModelPrivate::initColOffsets(in_RDI,(int)((ulong)pQVar4 >> 0x20));
    in_stack_fffffffffffffe98 = pQVar4;
  }
  QModelIndex::QModelIndex((QModelIndex *)0x15042d);
  (pQVar9->bottom).r = (undefined4)local_28;
  (pQVar9->bottom).c = local_28._4_4_;
  (pQVar9->bottom).i = local_20;
  (pQVar9->bottom).m.ptr = local_18;
  QString::QString((QString *)0x15046c);
  QString::QString((QString *)0x150479);
  QString::QString((QString *)0x150486);
  QSqlError::QSqlError
            ((QSqlError *)pQVar9,(QString *)CONCAT17(bVar1,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             (QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  QSqlError::operator=
            ((QSqlError *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88);
  QSqlError::~QSqlError((QSqlError *)0x1504d3);
  QString::~QString((QString *)0x1504e0);
  QString::~QString((QString *)0x1504ed);
  QString::~QString((QString *)0x1504fa);
  QSqlQuery::operator=((QSqlQuery *)in_RDI,(QSqlQuery *)in_stack_fffffffffffffe98);
  QSqlRecord::operator=
            ((QSqlRecord *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (QSqlRecord *)in_stack_fffffffffffffe88);
  pQVar9->field_0x108 = pQVar9->field_0x108 & 0xfe | 1;
  bVar2 = QSqlQuery::isForwardOnly((QSqlQuery *)0x150551);
  if (bVar2) {
    QVar8 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    type = QVar8.m_size._4_4_;
    databaseText = (QString *)QVar8.m_data;
    QVar8.m_data._0_7_ = in_stack_fffffffffffffec8;
    QVar8.m_size = (qsizetype)databaseText;
    QVar8.m_data._7_1_ = bVar1;
    QString::QString((QString *)in_RDI,QVar8);
    QString::QString((QString *)0x150599);
    QString::QString((QString *)0x1505a6);
    QSqlError::QSqlError
              ((QSqlError *)pQVar9,(QString *)CONCAT17(bVar1,in_stack_fffffffffffffec8),databaseText
               ,type,(QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    QSqlError::operator=
              ((QSqlError *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    QSqlError::~QSqlError((QSqlError *)0x1505f6);
    QString::~QString((QString *)0x150603);
    QString::~QString((QString *)0x150610);
    QString::~QString((QString *)0x15061d);
    endResetModel((QSqlQueryModel *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  else {
    bVar2 = QSqlQuery::isActive((QSqlQuery *)0x150645);
    if (bVar2) {
      pQVar6 = QSqlQuery::driver((QSqlQuery *)0x1506b0);
      uVar7 = (**(code **)(*(long *)pQVar6 + 0xb8))(pQVar6,1);
      if (((uVar7 & 1) == 0) ||
         (iVar3 = QSqlQuery::size((QSqlQuery *)in_stack_fffffffffffffe88), iVar3 < 1)) {
        QSqlRecord::count((QSqlRecord *)0x15076e);
        QAbstractItemModel::createIndex
                  ((QAbstractItemModel *)in_RDI,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   (int)in_stack_fffffffffffffe98,
                   (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        (pQVar9->bottom).r = (undefined4)local_100;
        (pQVar9->bottom).c = local_100._4_4_;
        (pQVar9->bottom).i = local_f8;
        (pQVar9->bottom).m.ptr = local_f0;
        pQVar9->field_0x108 = pQVar9->field_0x108 & 0xfe;
      }
      else {
        in_stack_fffffffffffffe94 = QSqlQuery::size((QSqlQuery *)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffe94 = in_stack_fffffffffffffe94 + -1;
        QSqlRecord::count((QSqlRecord *)0x150709);
        QAbstractItemModel::createIndex
                  ((QAbstractItemModel *)in_RDI,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   (int)in_stack_fffffffffffffe98,
                   (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        (pQVar9->bottom).r = (undefined4)local_e8;
        (pQVar9->bottom).c = local_e8._4_4_;
        (pQVar9->bottom).i = local_e0;
        (pQVar9->bottom).m.ptr = local_d8;
      }
      QModelIndex::QModelIndex((QModelIndex *)0x1507dc);
      (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,local_118);
      endResetModel((QSqlQueryModel *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
      ;
      (**(code **)(*(long *)in_RDI + 400))();
    }
    else {
      QSqlQuery::lastError((QSqlQuery *)in_stack_fffffffffffffe88);
      QSqlError::operator=
                ((QSqlError *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      QSqlError::~QSqlError((QSqlError *)0x150688);
      endResetModel((QSqlQueryModel *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
      ;
    }
  }
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x15081c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSqlQueryModel::setQuery(QSqlQuery &&query)
{
    Q_D(QSqlQueryModel);
    beginResetModel();

    QSqlRecord newRec = query.record();
    bool columnsChanged = (newRec != d->rec);

    if (d->colOffsets.size() != newRec.count() || columnsChanged)
        d->initColOffsets(newRec.count());

    d->bottom = QModelIndex();
    d->error = QSqlError();
    d->query = std::move(query);
    d->rec = newRec;
    d->atEnd = true;

    if (d->query.isForwardOnly()) {
        d->error = QSqlError("Forward-only queries cannot be used in a data model"_L1,
                             QString(), QSqlError::ConnectionError);
        endResetModel();
        return;
    }

    if (!d->query.isActive()) {
        d->error = d->query.lastError();
        endResetModel();
        return;
    }

    if (d->query.driver()->hasFeature(QSqlDriver::QuerySize) && d->query.size() > 0) {
        d->bottom = createIndex(d->query.size() - 1, d->rec.count() - 1);
    } else {
        d->bottom = createIndex(-1, d->rec.count() - 1);
        d->atEnd = false;
    }


    // fetchMore does the rowsInserted stuff for incremental models
    fetchMore();

    endResetModel();
    queryChange();
}